

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleMumpsCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  string local_7a8 [32];
  undefined1 local_788 [8];
  ostringstream cmCTestLog_msg_3;
  string local_610 [32];
  undefined1 local_5f0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  cmParseCacheCoverage ccov;
  undefined1 local_3d0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_250 [32];
  undefined1 local_230 [8];
  ostringstream cmCTestLog_msg;
  string local_a8;
  undefined1 local_88 [8];
  string coverageFile;
  cmParseGTMCoverage cov;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  cmParseGTMCoverage::cmParseGTMCoverage
            ((cmParseGTMCoverage *)((long)&coverageFile.field_2 + 8),cont,
             (this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_(&local_a8,(this->super_cmCTestGenericHandler).CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,"/gtm_coverage.mcov");
  std::__cxx11::string::~string((string *)&local_a8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    poVar4 = std::operator<<((ostream *)local_230,"Parsing Cache Coverage: ");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x365,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmParseMumpsCoverage::ReadCoverageFile
              ((cmParseMumpsCoverage *)((long)&coverageFile.field_2 + 8),pcVar3);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::size(&cont->TotalCoverage);
    this_local._4_4_ = (int)sVar5;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
    poVar4 = std::operator<<((ostream *)local_3d0," Cannot find GTM coverage file: ");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x36d,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&ccov.super_cmParseMumpsCoverage.CTest);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    cmParseCacheCoverage::cmParseCacheCoverage
              ((cmParseCacheCoverage *)local_438,cont,(this->super_cmCTestGenericHandler).CTest);
    cmCTest::GetBinaryDir_abi_cxx11_(&local_478,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_458,&local_478,"/cache_coverage.cmcov");
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f0);
      poVar4 = std::operator<<((ostream *)local_5f0,"Parsing Cache Coverage: ");
      poVar4 = std::operator<<(poVar4,(string *)local_88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x376,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_610);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f0);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmParseMumpsCoverage::ReadCoverageFile((cmParseMumpsCoverage *)local_438,pcVar3);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
      poVar4 = std::operator<<((ostream *)local_788," Cannot find Cache coverage file: ");
      poVar4 = std::operator<<(poVar4,(string *)local_88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x37d,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    }
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::size(&cont->TotalCoverage);
    this_local._4_4_ = (int)sVar5;
    cmParseCacheCoverage::~cmParseCacheCoverage((cmParseCacheCoverage *)local_438);
  }
  std::__cxx11::string::~string((string *)local_88);
  cmParseGTMCoverage::~cmParseGTMCoverage((cmParseGTMCoverage *)((long)&coverageFile.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleMumpsCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  // try gtm coverage
  cmParseGTMCoverage cov(*cont, this->CTest);
  std::string coverageFile = this->CTest->GetBinaryDir() +
    "/gtm_coverage.mcov";
  if(cmSystemTools::FileExists(coverageFile.c_str()))
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Parsing Cache Coverage: " << coverageFile
               << std::endl, this->Quiet);
    cov.ReadCoverageFile(coverageFile.c_str());
    return static_cast<int>(cont->TotalCoverage.size());
    }
  else
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Cannot find GTM coverage file: " << coverageFile
               << std::endl, this->Quiet);
    }
  cmParseCacheCoverage ccov(*cont, this->CTest);
  coverageFile = this->CTest->GetBinaryDir() +
    "/cache_coverage.cmcov";
  if(cmSystemTools::FileExists(coverageFile.c_str()))
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Parsing Cache Coverage: " << coverageFile
               << std::endl, this->Quiet);
    ccov.ReadCoverageFile(coverageFile.c_str());
    }
  else
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Cannot find Cache coverage file: " << coverageFile
               << std::endl, this->Quiet);
    }
  return static_cast<int>(cont->TotalCoverage.size());
}